

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildInitCachedScope(IRBuilder *this,int auxOffset,int offset)

{
  PropertyId objectId;
  RegSlot dstRegSlot;
  JITTimeFunctionBody *pJVar1;
  intptr_t address;
  AddrOpnd *src1Opnd_00;
  PropertyIdArray *propIds_00;
  Opnd *pOVar2;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *src1Opnd_01;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  Opnd *src2Opnd_00;
  Instr *instr_00;
  RegOpnd *dstOpnd_01;
  Instr *instrLdFuncExpr;
  PropertyIdArray *propIds;
  Opnd *formalsAreLetDeclOpnd;
  Opnd *src3Opnd;
  AddrOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  int offset_local;
  int auxOffset_local;
  IRBuilder *this_local;
  
  pJVar1 = Func::GetJITFunctionBody(this->m_func);
  address = JITTimeFunctionBody::GetFormalsPropIdArrayAddr(pJVar1);
  src1Opnd_00 = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  pJVar1 = Func::GetJITFunctionBody(this->m_func);
  propIds_00 = JITTimeFunctionBody::GetFormalsPropIdArray(pJVar1);
  objectId = Js::ActivationObjectEx::GetLiteralObjectRef(propIds_00);
  pOVar2 = BuildAuxObjectLiteralTypeRefOpnd(this,objectId);
  pJVar1 = Func::GetJITFunctionBody(this->m_func);
  dstRegSlot = JITTimeFunctionBody::GetLocalClosureReg(pJVar1);
  dstOpnd_00 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  src1Opnd_01 = IR::IntConstOpnd::New
                          ((ulong)(propIds_00->hasNonSimpleParams & 1),TyUint8,this->m_func,false);
  pRVar3 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar4 = IR::Instr::New(ExtendArg_A,&pRVar3->super_Opnd,&src1Opnd_01->super_Opnd,this->m_func);
  AddInstr(this,pIVar4,offset);
  pRVar3 = IR::RegOpnd::New(TyVar,this->m_func);
  src2Opnd_00 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(ExtendArg_A,&pRVar3->super_Opnd,pOVar2,src2Opnd_00,this->m_func);
  AddInstr(this,pIVar4,0xffffffff);
  pRVar3 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar2 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(ExtendArg_A,&pRVar3->super_Opnd,&src1Opnd_00->super_Opnd,pOVar2,
                          this->m_func);
  AddInstr(this,pIVar4,0xffffffff);
  Func::DisableCanDoInlineArgOpt(this->m_func);
  pRVar3 = IR::RegOpnd::New(TyVar,this->m_func);
  instr_00 = IR::Instr::New(LdFuncExpr,&pRVar3->super_Opnd,this->m_func);
  AddInstr(this,instr_00,0xffffffff);
  dstOpnd_01 = IR::RegOpnd::New(TyVar,this->m_func);
  pOVar2 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(ExtendArg_A,&dstOpnd_01->super_Opnd,&pRVar3->super_Opnd,pOVar2,
                          this->m_func);
  AddInstr(this,pIVar4,0xffffffff);
  pOVar2 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(InitCachedScope,&dstOpnd_00->super_Opnd,pOVar2,this->m_func);
  AddInstr(this,pIVar4,0xffffffff);
  return;
}

Assistant:

void IRBuilder::BuildInitCachedScope(int auxOffset, int offset)
{
    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    IR::AddrOpnd *  src2Opnd;
    IR::Opnd*       src3Opnd;
    IR::Opnd*       formalsAreLetDeclOpnd;

    src2Opnd = IR::AddrOpnd::New(m_func->GetJITFunctionBody()->GetFormalsPropIdArrayAddr(), IR::AddrOpndKindDynamicMisc, m_func);
    Js::PropertyIdArray * propIds = m_func->GetJITFunctionBody()->GetFormalsPropIdArray();
    src3Opnd = this->BuildAuxObjectLiteralTypeRefOpnd(Js::ActivationObjectEx::GetLiteralObjectRef(propIds));
    dstOpnd = this->BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());

    formalsAreLetDeclOpnd = IR::IntConstOpnd::New(propIds->hasNonSimpleParams, TyUint8, m_func);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), formalsAreLetDeclOpnd, m_func);
    this->AddInstr(instr, offset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    // Disable opt that normally gets disabled when we see LdFuncExpr in the byte code.
    m_func->DisableCanDoInlineArgOpt();
    src1Opnd = IR::RegOpnd::New(TyVar, m_func);
    IR::Instr * instrLdFuncExpr = IR::Instr::New(Js::OpCode::LdFuncExpr, src1Opnd, m_func);
    this->AddInstr(instrLdFuncExpr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::ExtendArg_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(Js::OpCode::InitCachedScope, dstOpnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}